

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_popAtIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar3;
  char *pcVar4;
  long lVar5;
  IntegerInstance IStack_88;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x20) {
    IntegerInstance::IntegerInstance(&IStack_88,value);
    lVar5 = (long)IStack_88._value;
    CharacterInstance::~CharacterInstance((CharacterInstance *)&IStack_88);
    if ((-1 < lVar5) &&
       (psVar1 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       IStack_88._value <
       (int)((ulong)((long)(this->_value).
                           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4))) {
      peVar2 = psVar1[lVar5].super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = psVar1[lVar5].super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::_M_erase
                (&this->_value,
                 (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar5);
      (**(code **)((long)peVar2->_vptr_Instance + 0x10))(__return_storage_ptr__,peVar2);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return __return_storage_ptr__;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: invalid argument.";
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: wrong number of arguments.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_popAtIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int index = IntegerInstance(arguments[0]).value();
    if (index < 0 || index >= int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    std::shared_ptr<Instance> instance = _value[index];
    _value.erase(_value.begin() + index);
    return instance->representation();
}